

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

double openjtalk_getMsdThreshold(OpenJTalk *oj)

{
  long in_RDI;
  double dVar1;
  double res;
  _Bool error;
  _Bool *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  byte in_stack_ffffffffffffffef;
  undefined8 local_8;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    local_8 = 0.0;
  }
  else {
    *(undefined4 *)(in_RDI + 0x678) = 0;
    dVar1 = Open_JTalk_get_msd_threshold
                      ((Open_JTalk *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),
                       in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if ((in_stack_ffffffffffffffef & 1) == 0) {
      *(double *)(in_RDI + 0x630) = dVar1;
      local_8 = *(double *)(in_RDI + 0x630);
    }
    else {
      *(undefined4 *)(in_RDI + 0x678) = 1;
      local_8 = 0.0;
    }
  }
  return local_8;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_getMsdThreshold(OpenJTalk *oj)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return 0.0;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	bool error;
	double res = Open_JTalk_get_msd_threshold(oj->open_jtalk, 0, &error);
	if (error)
	{
		oj->errorCode = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return 0.0;
	}
	oj->msd_threshold = res;
	return oj->msd_threshold;
}